

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  uchar filterType;
  byte bVar2;
  uchar *puVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ucvector *puVar14;
  uchar *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uchar *puVar21;
  size_t *psVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined8 *in_stack_00000008;
  uchar *dummy;
  ucvector attempt_1 [5];
  size_t size [5];
  ucvector attempt [5];
  uchar *local_538;
  uchar *local_500;
  ulong local_4f8;
  long local_4f0;
  LodePNGCompressSettings local_4e8 [2];
  ulong auStack_468 [6];
  ucvector local_438 [43];
  ulong length;
  
  uVar18 = (ulong)h;
  iVar10 = 0;
  if ((uint)info < 7) {
    iVar10 = *(int *)(&DAT_00248650 + ((ulong)info & 0xffffffff) * 4);
  }
  iVar10 = iVar10 * (uint)settings;
  if (iVar10 == 0) {
    uVar5 = 0x1f;
  }
  else {
    uVar5 = *(uint *)(in_stack_00000008 + 7);
    if ((uint)settings < 8) {
      uVar5 = 0;
    }
    if ((uint)info == 3) {
      uVar5 = 0;
    }
    if (*(int *)((long)in_stack_00000008 + 0x34) == 0) {
      uVar5 = *(uint *)(in_stack_00000008 + 7);
    }
    if (uVar5 < 5) {
      uVar9 = w * iVar10 + 7;
      uVar17 = uVar9 >> 3;
      length = (ulong)uVar17;
      uVar13 = (ulong)(iVar10 + 7U >> 3);
      switch(uVar5) {
      case 0:
        if (h != 0) {
          puVar15 = out + 1;
          uVar13 = 0;
          do {
            out[(length + 1) * uVar13] = '\0';
            if (7 < uVar9) {
              uVar11 = 0;
              do {
                puVar15[uVar11] = in[uVar11];
                uVar11 = uVar11 + 1;
              } while (length != uVar11);
            }
            uVar13 = uVar13 + 1;
            puVar15 = puVar15 + length + 1;
            in = in + length;
          } while (uVar13 != uVar18);
        }
        break;
      case 1:
        lVar19 = 0;
        do {
          puVar14 = (ucvector *)((long)&local_438[0].data + lVar19);
          puVar14->data = (uchar *)0x0;
          *(undefined8 *)((long)&local_438[0].size + lVar19) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar19) = 0;
          uVar5 = ucvector_reserve(puVar14,length);
          if (uVar5 == 0) {
            return 0x53;
          }
          *(ulong *)((long)&local_438[0].size + lVar19) = length;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        if (h != 0) {
          puVar15 = out + 1;
          uVar16 = 0;
          uVar5 = 0;
          uVar11 = 0;
          puVar21 = (uchar *)0x0;
          do {
            lVar20 = uVar16 * length;
            lVar19 = 0;
LAB_001b8efc:
            do {
              uVar7 = uVar5;
              lVar6 = lVar19;
              uVar12 = uVar11;
              puVar3 = local_438[lVar6].data;
              filterScanline(puVar3,in + lVar20,puVar21,length,uVar13,(uchar)lVar6);
              if (lVar6 == 0) {
                uVar11 = 0;
                lVar19 = 1;
                uVar5 = 0;
                if (uVar9 < 8) goto LAB_001b8efc;
                lVar19 = 0;
                uVar11 = 0;
                do {
                  uVar11 = uVar11 + puVar3[lVar19];
                  lVar19 = lVar19 + 1;
                } while (uVar17 != (uint)lVar19);
LAB_001b8f97:
                if (lVar6 != 0) goto LAB_001b8f9c;
                uVar5 = 0;
              }
              else {
                if (7 < uVar9) {
                  lVar19 = 0;
                  uVar11 = 0;
                  do {
                    bVar2 = puVar3[lVar19];
                    uVar5 = bVar2 ^ 0xff;
                    if (-1 < (char)bVar2) {
                      uVar5 = (uint)bVar2;
                    }
                    uVar11 = uVar11 + uVar5;
                    lVar19 = lVar19 + 1;
                  } while (uVar17 != (uint)lVar19);
                  goto LAB_001b8f97;
                }
                uVar11 = 0;
LAB_001b8f9c:
                bVar23 = uVar12 <= uVar11;
                if (bVar23) {
                  uVar11 = uVar12;
                }
                if (!bVar23) {
                  uVar7 = (uint)lVar6;
                }
                uVar5 = uVar7 & 0xff;
              }
              lVar19 = lVar6 + 1;
            } while (lVar6 + 1 != 5);
            out[(length + 1) * uVar16] = (uchar)uVar5;
            if (7 < uVar9) {
              puVar21 = local_438[uVar5].data;
              lVar19 = 0;
              do {
                puVar15[lVar19] = puVar21[lVar19];
                lVar19 = lVar19 + 1;
              } while (uVar17 != (uint)lVar19);
            }
            uVar16 = uVar16 + 1;
            puVar15 = puVar15 + length + 1;
            puVar21 = in + lVar20;
          } while (uVar16 != uVar18);
        }
        lVar19 = 0;
        do {
          *(undefined8 *)((long)&local_438[0].size + lVar19) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar19) = 0;
          free(*(void **)((long)&local_438[0].data + lVar19));
          *(undefined8 *)((long)&local_438[0].data + lVar19) = 0;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        break;
      case 2:
        lVar19 = 0;
        do {
          puVar14 = (ucvector *)((long)&local_4e8[0].btype + lVar19);
          puVar14->data = (uchar *)0x0;
          *(undefined8 *)((long)&local_4e8[0].windowsize + lVar19) = 0;
          *(undefined8 *)((long)&local_4e8[0].nicematch + lVar19) = 0;
          uVar5 = ucvector_reserve(puVar14,length);
          if (uVar5 == 0) {
            return 0x53;
          }
          *(ulong *)((long)&local_4e8[0].windowsize + lVar19) = length;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        if (h != 0) {
          lVar19 = length + 1;
          puVar15 = out + 1;
          fVar24 = 0.0;
          uVar11 = 0;
          uVar16 = 0;
          puVar21 = (uchar *)0x0;
          do {
            lVar20 = uVar11 * length;
            uVar12 = 0;
            do {
              puVar3 = *(uchar **)(&local_4e8[0].btype + uVar12 * 6);
              filterScanline(puVar3,in + lVar20,puVar21,length,uVar13,(uchar)uVar12);
              memset(local_438,0,0x400);
              if (7 < uVar9) {
                lVar6 = 0;
                do {
                  piVar1 = (int *)((long)&local_438[0].data + (ulong)puVar3[lVar6] * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar6 = lVar6 + 1;
                } while (uVar17 != (uint)lVar6);
              }
              piVar1 = (int *)((long)&local_438[0].data + uVar12 * 4);
              *piVar1 = *piVar1 + 1;
              fVar25 = 0.0;
              lVar6 = 0;
              do {
                uVar5 = *(uint *)((long)&local_438[0].data + lVar6 * 4);
                fVar26 = 0.0;
                if (uVar5 != 0) {
                  fVar26 = (float)uVar5 / (float)(int)lVar19;
                  fVar28 = 0.0;
                  for (fVar27 = 1.0 / fVar26; 32.0 < fVar27; fVar27 = fVar27 * 0.0625) {
                    fVar28 = fVar28 + 4.0;
                  }
                  for (; 2.0 < fVar27; fVar27 = fVar27 * 0.5) {
                    fVar28 = fVar28 + 1.0;
                  }
                  fVar26 = fVar26 * ((fVar27 * fVar27 * 3.0 * -0.5 +
                                      (fVar27 * fVar27 * fVar27) / 3.0 + fVar27 * 3.0 + -1.83333) *
                                     1.442695 + fVar28);
                }
                fVar25 = fVar25 + fVar26;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0x100);
              if (fVar25 < fVar24 || uVar12 == 0) {
                uVar16 = uVar12 & 0xffffffff;
                fVar24 = fVar25;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != 5);
            out[lVar19 * uVar11] = (uchar)uVar16;
            if (7 < uVar9) {
              lVar6 = *(long *)(&local_4e8[0].btype + uVar16 * 6);
              lVar8 = 0;
              do {
                puVar15[lVar8] = *(uchar *)(lVar6 + lVar8);
                lVar8 = lVar8 + 1;
              } while (uVar17 != (uint)lVar8);
            }
            uVar11 = uVar11 + 1;
            puVar15 = puVar15 + lVar19;
            puVar21 = in + lVar20;
          } while (uVar11 != uVar18);
        }
        lVar19 = 0;
        do {
          *(undefined8 *)((long)&local_4e8[0].windowsize + lVar19) = 0;
          *(undefined8 *)((long)&local_4e8[0].nicematch + lVar19) = 0;
          free(*(void **)((long)&local_4e8[0].btype + lVar19));
          *(undefined8 *)((long)&local_4e8[0].btype + lVar19) = 0;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        break;
      case 3:
        local_4e8[0]._8_8_ = in_stack_00000008[1];
        local_4e8[0]._16_8_ = in_stack_00000008[2];
        local_4e8[0].custom_context = (void *)in_stack_00000008[5];
        local_4e8[0].use_lz77 = (uint)((ulong)*in_stack_00000008 >> 0x20);
        local_4e8[0].btype = 1;
        local_4e8[0].custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        local_4e8[0].custom_deflate =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        lVar19 = 0;
        do {
          puVar14 = (ucvector *)((long)&local_438[0].data + lVar19);
          puVar14->data = (uchar *)0x0;
          *(undefined8 *)((long)&local_438[0].size + lVar19) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar19) = 0;
          uVar5 = ucvector_reserve(puVar14,length);
          if (uVar5 != 0) {
            *(ulong *)((long)&local_438[0].size + lVar19) = length;
          }
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        if (h != 0) {
          local_4f0 = length + 1;
          puVar15 = out + 1;
          uVar16 = 0;
          uVar12 = 0;
          uVar11 = 0;
          local_538 = (uchar *)0x0;
          local_4f8 = uVar18;
          do {
            lVar19 = uVar16 * length;
            lVar20 = 0;
            psVar22 = &local_438[0].size;
            uVar18 = 0;
            do {
              sVar4 = *psVar22;
              puVar21 = ((ucvector *)(psVar22 + -1))->data;
              filterScanline(puVar21,in + lVar19,local_538,length,uVar13,(uchar)uVar18);
              auStack_468[uVar18] = 0;
              local_500 = (uchar *)0x0;
              if (local_4e8[0].custom_zlib ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress
                          (&local_500,(size_t *)((long)auStack_468 + lVar20),puVar21,
                           (ulong)(uint)sVar4,local_4e8);
              }
              else {
                (*local_4e8[0].custom_zlib)
                          (&local_500,(size_t *)((long)auStack_468 + lVar20),puVar21,
                           (ulong)(uint)sVar4,local_4e8);
              }
              free(local_500);
              if (auStack_468[uVar18] < uVar11 || uVar18 == 0) {
                uVar12 = uVar18 & 0xffffffff;
                uVar11 = auStack_468[uVar18];
              }
              uVar18 = uVar18 + 1;
              psVar22 = psVar22 + 3;
              lVar20 = lVar20 + 8;
            } while (uVar18 != 5);
            out[local_4f0 * uVar16] = (uchar)uVar12;
            if (7 < uVar9) {
              puVar21 = local_438[uVar12].data;
              lVar20 = 0;
              do {
                puVar15[lVar20] = puVar21[lVar20];
                lVar20 = lVar20 + 1;
              } while (uVar17 != (uint)lVar20);
            }
            uVar16 = uVar16 + 1;
            puVar15 = puVar15 + local_4f0;
            local_538 = in + lVar19;
          } while (uVar16 != local_4f8);
        }
        lVar19 = 0;
        do {
          *(undefined8 *)((long)&local_438[0].size + lVar19) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar19) = 0;
          free(*(void **)((long)&local_438[0].data + lVar19));
          *(undefined8 *)((long)&local_438[0].data + lVar19) = 0;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x78);
        break;
      case 4:
        if (h != 0) {
          puVar21 = out + 1;
          uVar11 = 0;
          puVar15 = (uchar *)0x0;
          do {
            filterType = *(uchar *)(in_stack_00000008[8] + uVar11);
            puVar21[-1] = filterType;
            filterScanline(puVar21,in,puVar15,length,uVar13,filterType);
            uVar11 = uVar11 + 1;
            puVar21 = puVar21 + length + 1;
            puVar15 = in;
            in = in + length;
          } while (uVar18 != uVar11);
        }
      }
      uVar5 = 0;
    }
    else {
      uVar5 = 0x58;
    }
  }
  return uVar5;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type].data[x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}